

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

size_t nni_base64_encode(uint8_t *in,size_t in_len,char *out,size_t out_len)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar2 = 0;
  if (in_len == 0) {
    uVar6 = 0;
LAB_00138618:
    sVar3 = 0xffffffffffffffff;
    if (uVar6 < out_len) {
      out[uVar6] = '\0';
      sVar3 = uVar6;
    }
  }
  else {
    uVar8 = 0;
    uVar6 = 0;
    uVar4 = 0;
    do {
      bVar1 = in[uVar8];
      uVar2 = uVar2 << 8 | (uint)bVar1;
      uVar7 = uVar4 + 8;
      if (5 < uVar7) {
        iVar5 = (uVar4 + 2) / 6 + 1;
        do {
          if (out_len <= uVar6) goto LAB_00138635;
          uVar7 = uVar7 - 6;
          out[uVar6] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                       [uVar2 >> ((byte)uVar7 & 0x1f) & 0x3f];
          uVar6 = uVar6 + 1;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      uVar4 = uVar7;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 < in_len);
    if (uVar4 == 0) goto LAB_00138641;
    sVar3 = 0xffffffffffffffff;
    if (uVar6 < out_len) {
      out[uVar6] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)bVar1 << (6U - (char)uVar4 & 0x1f) & 0x3f];
      while( true ) {
        uVar6 = uVar6 + 1;
LAB_00138641:
        if ((uVar6 & 3) == 0) goto LAB_00138618;
        if (out_len <= uVar6) break;
        out[uVar6] = '=';
      }
LAB_00138635:
      sVar3 = 0xffffffffffffffff;
    }
  }
  return sVar3;
}

Assistant:

size_t
nni_base64_encode(const uint8_t *in, size_t in_len, char *out, size_t out_len)
{
	unsigned ii;
	unsigned rem;
	uint32_t v;
	size_t   io;

	const uint8_t encode[65] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
	                           "abcdefghijklmnopqrstuvwxyz"
	                           "0123456789+/";

	for (io = 0, ii = 0, v = 0, rem = 0; ii < in_len; ii++) {
		uint8_t ch = in[ii];
		v          = (v << 8u) | ch;
		rem += 8;
		while (rem >= 6) {
			rem -= 6;
			if (io >= out_len)
				return (-1);
			out[io++] = encode[(v >> rem) & 63u];
		}
	}

	if (rem) {
		v <<= (6 - rem);
		if (io >= out_len)
			return (-1);
		out[io++] = encode[v & 63u];
	}

	// Pad to a multiple of 3.
	while (io & 3u) {
		if (io >= out_len)
			return (-1);
		out[io++] = '=';
	}

	if (io >= out_len)
		return (-1);

	out[io] = '\0';

	return (io);
}